

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O0

uint32_t PaletteColorDistance(uint32_t col1,uint32_t col2)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t in_ESI;
  uint32_t in_EDI;
  uint32_t score;
  int kMoreWeightForRGBThanForAlpha;
  uint32_t diff;
  
  uVar1 = VP8LSubPixels(in_EDI,in_ESI);
  uVar2 = PaletteComponentDistance(uVar1 & 0xff);
  uVar3 = PaletteComponentDistance(uVar1 >> 8 & 0xff);
  uVar4 = PaletteComponentDistance(uVar1 >> 0x10 & 0xff);
  uVar1 = PaletteComponentDistance(uVar1 >> 0x18);
  return uVar1 + (uVar4 + uVar3 + uVar2) * 9;
}

Assistant:

static WEBP_INLINE uint32_t PaletteColorDistance(uint32_t col1, uint32_t col2) {
  const uint32_t diff = VP8LSubPixels(col1, col2);
  const int kMoreWeightForRGBThanForAlpha = 9;
  uint32_t score;
  score = PaletteComponentDistance((diff >> 0) & 0xff);
  score += PaletteComponentDistance((diff >> 8) & 0xff);
  score += PaletteComponentDistance((diff >> 16) & 0xff);
  score *= kMoreWeightForRGBThanForAlpha;
  score += PaletteComponentDistance((diff >> 24) & 0xff);
  return score;
}